

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O3

ssize_t __thiscall File::read(File *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  sVar1 = ::read(*(int *)&this->fp,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  return sVar1;
}

Assistant:

ssize File::read(void* buffer, usize len)
{
#ifdef _WIN32
#ifdef _AMD64
  byte* bufferStart = (byte*)buffer;
  DWORD i;
  while(len > (usize)INT_MAX)
  {
    if(!ReadFile((HANDLE)fp, buffer, INT_MAX, &i, NULL))
      return -1;
    buffer = (byte*)buffer + i;
    if(i != INT_MAX)
      return (byte*)buffer - bufferStart;
    len -= INT_MAX;
  }
  if(!ReadFile((HANDLE)fp, buffer, (DWORD)len, &i, NULL))
    return -1;
  buffer = (byte*)buffer + i;
  return (byte*)buffer - bufferStart;
#else
  DWORD i;
  if(!ReadFile((HANDLE)fp, buffer, len, &i, NULL))
    return -1;
  return i;
#endif
#else
  return ::read((int)(intptr_t)fp, buffer, len);
#endif
}